

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O2

void ssh_server_free_callback(void *vsrv)

{
  LogPolicy *lp;
  
  logeventf(*(LogContext **)((long)vsrv + 0xa8),"freeing server instance");
  bufchain_clear((bufchain *)vsrv);
  bufchain_clear((bufchain *)((long)vsrv + 0x28));
  bufchain_clear((bufchain *)((long)vsrv + 0x70));
  if (*(long **)((long)vsrv + 0xd8) != (long *)0x0) {
    (**(code **)(**(long **)((long)vsrv + 0xd8) + 8))();
  }
  if (*(agentfwd **)((long)vsrv + 0x130) != (agentfwd *)0x0) {
    agentfwd_free(*(agentfwd **)((long)vsrv + 0x130));
  }
  if (*(PacketProtocolLayer **)((long)vsrv + 0x158) != (PacketProtocolLayer *)0x0) {
    ssh_ppl_free(*(PacketProtocolLayer **)((long)vsrv + 0x158));
  }
  if (*(BinaryPacketProtocol **)((long)vsrv + 0x150) != (BinaryPacketProtocol *)0x0) {
    ssh_bpp_free(*(BinaryPacketProtocol **)((long)vsrv + 0x150));
  }
  delete_callbacks_for_context(vsrv);
  conf_free(*(Conf **)((long)vsrv + 0xf0));
  log_free(*(LogContext **)((long)vsrv + 0xa8));
  safefree(*(void **)((long)vsrv + 0x168));
  lp = *(LogPolicy **)((long)vsrv + 0x120);
  safefree(vsrv);
  server_instance_terminated(lp);
  return;
}

Assistant:

static void ssh_server_free_callback(void *vsrv)
{
    server *srv = (server *)vsrv;

    logeventf(srv->logctx, "freeing server instance");

    bufchain_clear(&srv->in_raw);
    bufchain_clear(&srv->out_raw);
    bufchain_clear(&srv->dummy_user_input);

    if (srv->socket)
        sk_close(srv->socket);

    if (srv->stunt_agentfwd)
        agentfwd_free(srv->stunt_agentfwd);

    if (srv->base_layer)
        ssh_ppl_free(srv->base_layer);
    if (srv->bpp)
        ssh_bpp_free(srv->bpp);

    delete_callbacks_for_context(srv);

    conf_free(srv->conf);
    log_free(srv->logctx);

#ifndef NO_GSSAPI
    sfree(srv->gss_state.libs);        /* FIXME: replace with sensible */
#endif

    LogPolicy *lp = srv->logpolicy;
    sfree(srv);

    server_instance_terminated(lp);
}